

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naming.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::rust::UnderscoreDelimitFullName_abi_cxx11_
          (string *__return_storage_ptr__,rust *this,Context *ctx,string_view full_name)

{
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_70;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_50;
  undefined8 local_48;
  allocator<char> local_2a;
  undefined1 local_29;
  rust *local_28;
  Context *ctx_local;
  string_view full_name_local;
  string *result;
  
  full_name_local._M_len = full_name._M_len;
  local_29 = 0;
  local_28 = this;
  ctx_local = ctx;
  full_name_local._M_str = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)&ctx_local,&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_70,(char (*) [2])0x6da370,(char (*) [2])0x6bc912);
  local_50 = &local_70;
  local_48 = 1;
  absl::lts_20240722::StrReplaceAll(local_50,1,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string UnderscoreDelimitFullName(Context& ctx,
                                      absl::string_view full_name) {
  std::string result = std::string(full_name);
  absl::StrReplaceAll({{".", "_"}}, &result);
  return result;
}